

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt_next(getopt_context_t *ctx)

{
  char cVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  char *__s;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  getopt_option_type_t gVar10;
  int iVar11;
  ulong __n;
  getopt_option_t *found_opt;
  
  iVar6 = ctx->current_index;
  iVar2 = ctx->argc;
  if (iVar6 == iVar2) {
    return -1;
  }
  ctx->current_opt_arg = (char *)0x0;
  ppcVar3 = ctx->argv;
  pcVar4 = ppcVar3[iVar6];
  iVar11 = iVar6 + 1;
  ctx->current_index = iVar11;
  if ((*pcVar4 != '\0') && (*pcVar4 != '-')) {
    ctx->current_opt_arg = pcVar4;
    return 0x2b;
  }
  cVar1 = pcVar4[1];
  if (cVar1 != '\0') {
    if (cVar1 == '-') {
      if (pcVar4[2] != '\0') {
        lVar9 = (long)ctx->num_opts;
        if (0 < lVar9) {
          pcVar8 = pcVar4 + 2;
          found_opt = ctx->opts;
LAB_0014a50e:
          __s = found_opt->name;
          if (__s != (char *)0x0) {
            sVar7 = strlen(__s);
            __n = sVar7 & 0xffffffff;
            iVar5 = strncasecmp(__s,pcVar8,__n);
            if (iVar5 == 0) {
              gVar10 = found_opt->type;
              if (gVar10 - GETOPT_OPTION_TYPE_FLAG_SET < 0xfffffffa) goto LAB_0014a654;
              if (pcVar8[__n] == '=') {
                if (pcVar4[__n + 3] != '\0') {
                  pcVar8 = pcVar8 + __n + 1;
                  goto LAB_0014a6f8;
                }
                iVar5 = 2;
              }
              else {
                if (pcVar8[__n] != '\0') goto LAB_0014a560;
                if (iVar2 <= iVar11) goto LAB_0014a654;
                pcVar8 = ppcVar3[iVar11];
                if (*pcVar8 != '=') {
                  if (*pcVar8 == '-') goto LAB_0014a654;
                  ctx->current_index = iVar6 + 2;
                  goto LAB_0014a6f8;
                }
                iVar11 = iVar6 + 2;
                ctx->current_index = iVar11;
                if (pcVar8[1] != '\0') {
                  pcVar8 = pcVar8 + 1;
                  goto LAB_0014a6f8;
                }
                iVar5 = 3;
              }
              if (iVar2 <= iVar11) goto LAB_0014a654;
              ctx->current_index = iVar5 + iVar6;
              pcVar8 = ppcVar3[iVar11];
              if (pcVar8 == (char *)0x0) goto LAB_0014a654;
              gVar10 = found_opt->type;
LAB_0014a6f8:
              ctx->current_opt_arg = pcVar8;
              if (GETOPT_OPTION_TYPE_FLAG_OR < gVar10) {
                return -1;
              }
              if ((0x78U >> (gVar10 & 0x1f) & 1) != 0) {
                iVar6 = getopt_read_value(ctx,found_opt);
                return iVar6;
              }
              if ((0x381U >> (gVar10 & 0x1f) & 1) != 0) {
                ctx->current_opt_arg = (char *)0x0;
                return 0x2b;
              }
              goto switchD_0014a670_caseD_0;
            }
          }
LAB_0014a560:
          found_opt = found_opt + 1;
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) goto LAB_0014a5a8;
          goto LAB_0014a50e;
        }
LAB_0014a5a8:
        ctx->current_opt_arg = pcVar4;
        return 0x3f;
      }
    }
    else if (pcVar4[2] == '\0') {
      lVar9 = (long)ctx->num_opts;
      if (0 < lVar9) {
        found_opt = ctx->opts;
        do {
          if (found_opt->name_short == (int)cVar1) {
            if (((iVar11 == iVar2) || (pcVar8 = ppcVar3[(long)iVar6 + 1], *pcVar8 == '-')) ||
               (gVar10 = found_opt->type, gVar10 - GETOPT_OPTION_TYPE_FLAG_SET < 0xfffffffa))
            goto LAB_0014a654;
            ctx->current_index = iVar6 + 2;
            goto LAB_0014a6f8;
          }
          found_opt = found_opt + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      goto LAB_0014a5a8;
    }
  }
  ctx->current_opt_arg = pcVar4;
  return 0x21;
LAB_0014a654:
  iVar6 = -1;
  switch(found_opt->type) {
  case GETOPT_OPTION_TYPE_NO_ARG:
  case GETOPT_OPTION_TYPE_OPTIONAL:
  case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
  case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
switchD_0014a670_caseD_0:
    return found_opt->value;
  case GETOPT_OPTION_TYPE_REQUIRED:
  case GETOPT_OPTION_TYPE_REQUIRED_INT32:
  case GETOPT_OPTION_TYPE_REQUIRED_FP32:
    ctx->current_opt_arg = found_opt->name;
    return 0x21;
  case GETOPT_OPTION_TYPE_FLAG_SET:
    *found_opt->flag = found_opt->value;
    break;
  case GETOPT_OPTION_TYPE_FLAG_AND:
    *found_opt->flag = *found_opt->flag & found_opt->value;
    break;
  case GETOPT_OPTION_TYPE_FLAG_OR:
    *found_opt->flag = *found_opt->flag | found_opt->value;
    break;
  default:
    goto switchD_0014a670_default;
  }
  iVar6 = 0;
switchD_0014a670_default:
  return iVar6;
}

Assistant:

int getopt_next( getopt_context_t* ctx )
{
	/* are all options processed? */
	if(ctx->current_index == ctx->argc )
		return -1;

	/* reset opt-arg */
	ctx->current_opt_arg = 0x0;

	const char* curr_token = ctx->argv[ ctx->current_index ];
	
	/* this token has been processed! */
	ctx->current_index++;

	/* check if item is no option */
	if( curr_token[0] && curr_token[0] != '-' )
	{
		ctx->current_opt_arg = curr_token;
		return '+'; /* return '+' as identifier for no option! */
	}
	
	const getopt_option_t* found_opt = 0x0;
	const char* found_arg = 0x0;

	/* short opt */
	if( curr_token[1] != '\0' && curr_token[1] != '-' && curr_token[2] == '\0' )
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const getopt_option_t* opt = ctx->opts + i;

			if( opt->name_short == curr_token[1] )
			{
				found_opt = opt;

				/* if there is an value when: - current_index < argc and value in argv[current_index] do not start with '-' */
				if( ( ( ctx->current_index != ctx->argc) && ( ctx->argv[ctx->current_index][0] != '-' ) ) && 
					  getopt_opt_might_have_arg(opt) )
				{
					found_arg = ctx->argv[ctx->current_index];
					ctx->current_index++; /* next token has been processed aswell! */
				}
				break;
			}
		}
	}
	/* long opt */
	else if(curr_token[1] == '-' && curr_token[2] != '\0')
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const char* check_option = curr_token + 2;

			const getopt_option_t* opt = ctx->opts + i;

			if(!opt->name)
				continue;

			unsigned int name_len = (unsigned int)strlen( opt->name );

			if( str_case_cmp_len( opt->name, check_option, name_len ) == 0 )
			{
				check_option += name_len;

				/* find arg if there is any */
				if(getopt_opt_might_have_arg(opt))
				{
					switch( *check_option )
					{
						case '\0':
						{
							if( ctx->current_index < ctx->argc ) /* are there more tokens that can contain the '='? */
							{
								const char* next_token = ctx->argv[ ctx->current_index ];
								if( next_token[0] == '=' )
								{
									ctx->current_index++; /* next token has been processed aswell! */

									if( next_token[1] != '\0' ) /* does this token contain the arg-value? */
										found_arg = next_token + 1;
									else if( ctx->current_index < ctx->argc )
										found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
								}
								else if( next_token[0] != '-' )
								{
									ctx->current_index++; /* next token has been processed aswell! */
									found_arg = next_token;
								}
							}
						}
						break;
						case '=':
							if( check_option[1] != '\0' )
								found_arg = check_option + 1;
							else if( ctx->current_index < ctx->argc )
								found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
						break;
						default:
							/* not found, matched for example --test but it was --testing*/
							continue;
					}
				}

				found_opt = opt;
				break;
			}
		}
	}
	/* malformed opt "-", "-xyz" or "--" */
	else
	{
		ctx->current_opt_arg = curr_token;
		return '!';
	}

	/* found no matching option! */
	if(found_opt == 0x0)
	{
		ctx->current_opt_arg = curr_token;
		return '?';
	}

	if(found_arg != 0x0)
	{
		ctx->current_opt_arg = found_arg;

		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET:
			case GETOPT_OPTION_TYPE_FLAG_AND:
			case GETOPT_OPTION_TYPE_FLAG_OR:
			case GETOPT_OPTION_TYPE_NO_ARG:
				/* these types should have no argument, usage error! */
				ctx->current_opt_arg = 0x0;
				return '+';

			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_REQUIRED:
				return found_opt->value;
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				return getopt_read_value(ctx, found_opt);
		}
	}
	/* no argument found */
	else
	{
		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET: *found_opt->flag  = found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_AND: *found_opt->flag &= found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_OR:  *found_opt->flag |= found_opt->value; return 0; /* zero is "a flag was set!" */
			
			case GETOPT_OPTION_TYPE_NO_ARG:
			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
				return found_opt->value;

			/* the option requires an argument! (--option=arg, -o arg) */
			case GETOPT_OPTION_TYPE_REQUIRED:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				ctx->current_opt_arg = found_opt->name;
				return '!';
		}
	}

 	return -1;
}